

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ExpressionBinder::QualifyColumnNameWithManyDots
          (ExpressionBinder *this,ColumnRefExpression *col_ref,ErrorData *error)

{
  undefined8 uVar1;
  idx_t *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *base;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  idx_t struct_extract_start;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  local_40._8_8_ =
       (long)(*(long *)((long)&(error->final_message).field_2 + 8) -
             (error->final_message).field_2._M_allocated_capacity) >> 5;
  QualifyColumnNameWithManyDotsInternal((ExpressionBinder *)local_50,col_ref,error,in_RCX);
  if ((element_type *)local_50._0_8_ == (element_type *)0x0) {
    local_50._0_8_ = (element_type *)0x0;
  }
  else if ((ulong)local_40._8_8_ <
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(*(long *)((long)&(error->final_message).field_2 + 8) -
                  (error->final_message).field_2._M_allocated_capacity) >> 5)) {
    __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_;
    do {
      local_50._8_8_ = local_50._0_8_;
      local_50._0_8_ = (_func_int **)0x0;
      base = __n;
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&(error->final_message).field_2,(size_type)__n);
      CreateStructExtract((ExpressionBinder *)local_40,
                          (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)base,(string *)(local_50 + 8));
      uVar1 = local_50._0_8_;
      local_50._0_8_ = local_40._0_8_;
      if ((_func_int **)uVar1 != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)uVar1 + 8))();
      }
      if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
        (*(*(_func_int ***)local_50._8_8_)[1])();
      }
      __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       *)&__n->_vptr__Sp_counted_base)->_M_t).
                    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 1);
    } while (__n < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)(*(long *)((long)&(error->final_message).field_2 + 8) -
                          (error->final_message).field_2._M_allocated_capacity) >> 5));
  }
  this->_vptr_ExpressionBinder = (_func_int **)local_50._0_8_;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ExpressionBinder::QualifyColumnNameWithManyDots(ColumnRefExpression &col_ref,
                                                                             ErrorData &error) {
	idx_t struct_extract_start = col_ref.column_names.size();
	auto result_expr = QualifyColumnNameWithManyDotsInternal(col_ref, error, struct_extract_start);
	if (!result_expr) {
		return nullptr;
	}

	// create a struct extract with all remaining column names
	for (idx_t i = struct_extract_start; i < col_ref.column_names.size(); i++) {
		result_expr = CreateStructExtract(std::move(result_expr), col_ref.column_names[i]);
	}

	return result_expr;
}